

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

int Fraig_TableRehashF0(Fraig_Man_t *pMan,int fLinkEquiv)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t *pFVar3;
  ulong uVar4;
  Fraig_Node_t **ppFVar5;
  Fraig_Node_t **ppFVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  Fraig_Node_t *pFVar11;
  Fraig_Node_t *pFVar12;
  Fraig_Node_t *pFVar13;
  
  pFVar2 = pMan->pTableF0;
  uVar1 = pFVar2->nBins;
  ppFVar5 = (Fraig_Node_t **)calloc(1,(long)(int)uVar1 << 3);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  iVar7 = 0;
  iVar10 = 0;
  do {
    if (uVar8 == uVar9) {
      if (iVar10 != pFVar2->nEntries) {
        __assert_fail("Counter == pT->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigTable.c"
                      ,0x28b,"int Fraig_TableRehashF0(Fraig_Man_t *, int)");
      }
      free(pFVar2->pBins);
      pFVar2->pBins = ppFVar5;
      return iVar7;
    }
    pFVar11 = pFVar2->pBins[uVar8];
    if (pFVar11 != (Fraig_Node_t *)0x0) goto LAB_0054d4b4;
    pFVar13 = (Fraig_Node_t *)0x0;
    pFVar12 = pFVar11;
LAB_0054d43b:
    pFVar11 = pFVar13;
    if (pFVar12 != (Fraig_Node_t *)0x0) {
      do {
        pFVar13 = pFVar12;
        pFVar3 = pFVar12->pNextD;
        do {
          pFVar12 = pFVar3;
          if (pFVar13 == (Fraig_Node_t *)0x0) {
            pFVar13 = (Fraig_Node_t *)0x0;
            pFVar12 = pFVar11;
            if (pFVar11 != (Fraig_Node_t *)0x0) {
LAB_0054d4b4:
              pFVar13 = pFVar11->pNextF;
              pFVar12 = pFVar11;
            }
            goto LAB_0054d43b;
          }
          uVar4 = (ulong)pFVar13->uHashD % (ulong)uVar1;
          if (fLinkEquiv != 0) {
            ppFVar6 = ppFVar5 + uVar4;
            while (pFVar3 = *ppFVar6, pFVar3 != (Fraig_Node_t *)0x0) {
              if (pFVar13->uHashD == pFVar3->uHashD) {
                pFVar13->pNextD = pFVar3->pNextD;
                pFVar3->pNextD = pFVar13;
                iVar7 = 1;
                goto LAB_0054d494;
              }
              ppFVar6 = &pFVar3->pNextF;
            }
          }
          pFVar13->pNextF = ppFVar5[uVar4];
          ppFVar5[uVar4] = pFVar13;
          pFVar13->pNextD = (Fraig_Node_t *)0x0;
LAB_0054d494:
          iVar10 = iVar10 + 1;
          pFVar13 = pFVar12;
          pFVar3 = (Fraig_Node_t *)0x0;
        } while (pFVar12 == (Fraig_Node_t *)0x0);
      } while( true );
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int Fraig_TableRehashF0( Fraig_Man_t * pMan, int fLinkEquiv )
{
    Fraig_HashTable_t * pT = pMan->pTableF0;
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEntF, * pEntF2, * pEnt, * pEntD2, * pEntN;
    int ReturnValue, Counter, i;
    unsigned Key;

    // allocate a new array of bins
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, pT->nBins );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * pT->nBins );

    // rehash the entries in the table
    // go through all the nodes in the F-lists (and possible in D-lists, if used)
    Counter = 0;
    ReturnValue = 0;
    for ( i = 0; i < pT->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( pT->pBins[i], pEntF, pEntF2 )
        Fraig_TableBinForEachEntrySafeD( pEntF, pEnt, pEntD2 )
        {
            // decide where to put entry pEnt
            Key = pEnt->uHashD % pT->nBins;
            if ( fLinkEquiv )
            {
                // go through the entries in the new bin
                Fraig_TableBinForEachEntryF( pBinsNew[Key], pEntN )
                {
                    // if they have different values skip
                    if ( pEnt->uHashD != pEntN->uHashD )
                        continue;
                    // they have the same hash value, add pEnt to the D-list pEnt3
                    pEnt->pNextD  = pEntN->pNextD;
                    pEntN->pNextD = pEnt;
                    ReturnValue = 1;
                    Counter++;
                    break;
                }
                if ( pEntN != NULL ) // already linked
                    continue;
                // we did not find equal entry
            }
            // link the new entry
            pEnt->pNextF  = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            pEnt->pNextD  = NULL;
            Counter++;
        }
    assert( Counter == pT->nEntries );
    // replace the table and the parameters
    ABC_FREE( pT->pBins );
    pT->pBins = pBinsNew;
    return ReturnValue;
}